

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server_test.c
# Opt level: O3

void test_server_post_redirect(void)

{
  nng_http_client *conn;
  nng_err nVar1;
  int iVar2;
  nng_http_status nVar3;
  char *pcVar4;
  size_t sz;
  undefined1 local_878 [8];
  server_test st;
  size_t size;
  void *data;
  nng_http_handler *h;
  char txdata [5];
  
  nVar1 = nng_http_handler_alloc_redirect
                    ((nng_http_handler **)&data,"/here",NNG_HTTP_STATUS_STATUS_MOVED_PERMANENTLY,
                     "http://127.0.0.1/there");
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                         ,0x2ab,"%s: expected success, got %s (%d)",
                         "nng_http_handler_alloc_redirect( &h, \"/here\", 301, \"http://127.0.0.1/there\")"
                         ,pcVar4,nVar1);
  if (iVar2 != 0) {
    server_setup((server_test *)local_878,(nng_http_handler *)data);
    h._4_1_ = 0;
    h._0_4_ = 0x34333231;
    nVar1 = nng_http_set_uri((nng_http *)st.cli,"/here",(char *)0x0);
    pcVar4 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                           ,0x2af,"%s: expected success, got %s (%d)",
                           "nng_http_set_uri(st.conn, \"/here\", NULL)",pcVar4,nVar1);
    conn = st.cli;
    if (iVar2 != 0) {
      sz = strlen((char *)&h);
      nng_http_set_body((nng_http *)conn,&h,sz);
      nng_http_set_method((nng_http *)st.cli,"POST");
      nVar1 = httpdo((server_test *)local_878,(void **)&size,(size_t *)(st.urlstr + 0x7f8));
      pcVar4 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                             ,0x2b2,"%s: expected success, got %s (%d)",
                             "httpdo(&st, (void **) &data, &size)",pcVar4,nVar1);
      if (iVar2 != 0) {
        nVar3 = nng_http_get_status((nng_http *)st.cli);
        acutest_check_((uint)(nVar3 == NNG_HTTP_STATUS_STATUS_MOVED_PERMANENTLY),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                       ,0x2b3,"%s","nng_http_get_status(st.conn) == 301");
        pcVar4 = nng_http_get_header((nng_http *)st.cli,"Location");
        acutest_check_((uint)(pcVar4 != (char *)0x0),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                       ,0x2b5,"%s","dest != NULL");
        iVar2 = strcmp(pcVar4,"http://127.0.0.1/there");
        acutest_check_((uint)(iVar2 == 0),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                       ,0x2b6,"%s == %s",pcVar4,"http://127.0.0.1/there");
        nng_free((void *)size,st.urlstr._2040_8_);
        server_free((server_test *)local_878);
        return;
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_server_post_redirect(void)
{
	size_t      size;
	char        txdata[5];
	const char *dest;
	void       *data;

	struct server_test st;
	nng_http_handler  *h;

	NUTS_PASS(nng_http_handler_alloc_redirect(
	    &h, "/here", 301, "http://127.0.0.1/there"));
	server_setup(&st, h);

	snprintf(txdata, sizeof(txdata), "1234");
	NUTS_PASS(nng_http_set_uri(st.conn, "/here", NULL));
	nng_http_set_body(st.conn, txdata, strlen(txdata));
	nng_http_set_method(st.conn, "POST");
	NUTS_PASS(httpdo(&st, (void **) &data, &size));
	NUTS_TRUE(nng_http_get_status(st.conn) == 301);
	dest = nng_http_get_header(st.conn, "Location");
	NUTS_TRUE(dest != NULL);
	NUTS_MATCH(dest, "http://127.0.0.1/there");
	nng_free(data, size);
	server_free(&st);
}